

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  clock_t cVar3;
  clock_t cVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  uint local_40;
  
  if (argc < 2) {
    pcVar7 = "xxh3";
    printf("No test hash given on command line, testing %s.\n","xxh3");
    puts("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n or --test=Speed,... hash");
  }
  else {
    pcVar7 = argv[1];
    if ((*pcVar7 == '-') && (pcVar7[1] == '-')) {
      iVar1 = strcmp(pcVar7,"--help");
      if (iVar1 == 0) {
        puts("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n or --test=Speed,... hash");
      }
      else {
        iVar1 = strcmp(pcVar7,"--list");
        if (iVar1 == 0) {
          lVar6 = 0x20;
          do {
            printf("%-16s\t\"%s\" %s\n",*(undefined8 *)((long)quality_str + lVar6 + 0x10),
                   *(undefined8 *)(lVar6 + 0x1ad328),
                   quality_str[*(uint *)((long)&g_hashes[0].hash + lVar6)]);
            lVar6 = lVar6 + 0x28;
          } while (lVar6 != 0x1240);
        }
        else {
          iVar1 = strcmp(pcVar7,"--tests");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar7,"--verbose");
            local_40 = 1;
            if (iVar1 == 0) {
              local_40 = 2;
              g_drawDiagram = true;
              if (argc == 2) {
                pcVar7 = "xxh3";
              }
              else {
                pcVar7 = argv[2];
              }
            }
            iVar1 = strcmp(pcVar7,"--extra");
            if (iVar1 == 0) {
              local_40 = local_40 + 1;
              g_testExtra = true;
              if (local_40 < (uint)argc) {
                pcVar7 = argv[local_40];
              }
              else {
                pcVar7 = "xxh3";
              }
            }
            iVar1 = strncmp(pcVar7,"--test=",6);
            if (iVar1 == 0) {
              bVar5 = false;
              g_testAll = false;
              pcVar7 = pcVar7 + 7;
              do {
                pcVar2 = strchr(pcVar7,0x2c);
                pcVar8 = pcVar7;
                if (pcVar2 != (char *)0x0) {
                  pcVar7 = strndup(pcVar7,(long)pcVar2 - (long)pcVar7);
                  pcVar8 = pcVar2 + 1;
                }
                lVar6 = 8;
                do {
                  iVar1 = strcmp(pcVar7,*(char **)((long)&g_testopts[0].var + lVar6));
                  if (iVar1 == 0) {
                    **(undefined1 **)(lVar6 + 0x1ad1e8) = 1;
                    goto LAB_00107a07;
                  }
                  lVar6 = lVar6 + 0x10;
                } while (lVar6 != 0x128);
                if (!bVar5) {
                  printf("Invalid option: --test=%s\n",pcVar7);
                  printf("Valid tests: --test=%s",g_testopts[0].name);
                  lVar6 = 0x18;
                  do {
                    printf(",%s",*(undefined8 *)((long)&g_testopts[0].var + lVar6));
                    lVar6 = lVar6 + 0x10;
                  } while (lVar6 != 0x128);
                  putchar(10);
                  goto LAB_00107b1a;
                }
LAB_00107a07:
                bVar5 = true;
                pcVar7 = pcVar8;
              } while (pcVar2 != (char *)0x0);
            }
            if ((int)(local_40 + 1) < argc) {
              pcVar7 = argv[local_40 + 1];
            }
            else {
              pcVar7 = "xxh3";
            }
            goto LAB_00107a2e;
          }
          puts("Valid tests:");
          lVar6 = 8;
          do {
            printf("  %s\n",*(undefined8 *)((long)&g_testopts[0].var + lVar6));
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x128);
        }
      }
LAB_00107b1a:
      exit(0);
    }
  }
LAB_00107a2e:
  cVar3 = clock();
  testHash(pcVar7);
  cVar4 = clock();
  putchar(10);
  fflush((FILE *)0x0);
  printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",(ulong)g_inputVCode,
         (ulong)g_outputVCode,(ulong)g_resultVCode);
  printf("Verification value is 0x%08x - Testing took %f seconds\n",
         (double)((int)cVar4 - (int)cVar3) / 1000000.0,(ulong)g_verify);
  puts("-------------------------------------------------------------------------------");
  fflush((FILE *)0x0);
  return 0;
}

Assistant:

int main ( int argc, const char ** argv )
{
#if (defined(__x86_64__) && __SSE4_2__) || defined(_M_X64) || defined(_X86_64_)
  const char * defaulthash = "xxh3"; // because it fails some tests
#else
  const char * defaulthash = "wyhash";
#endif
  const char * hashToTest = defaulthash;

  if(argc < 2) {
    printf("No test hash given on command line, testing %s.\n", hashToTest);
    printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n"
           " or --test=Speed,... hash\n");
  }
  else {
    int i = 1;
    hashToTest = argv[i];

    if (strncmp(hashToTest,"--", 2) == 0) {
      if (strcmp(hashToTest,"--help") == 0) {
        printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n"
               " or --test=Speed,... hash\n");
        exit(0);
      }
      if (strcmp(hashToTest,"--list") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%-16s\t\"%s\" %s\n", g_hashes[i].name, g_hashes[i].desc, quality_str[g_hashes[i].quality]);
        }
        exit(0);
      }
      if (strcmp(hashToTest,"--tests") == 0) {
        printf("Valid tests:\n");
        for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
          printf("  %s\n", g_testopts[i].name);
        }
        exit(0);
      }
      if (strcmp(hashToTest,"--verbose") == 0) {
        g_drawDiagram = true;
        i++;
        if (argc > i)
          hashToTest = argv[i];
        else
          hashToTest = defaulthash;
      }
      if (strcmp(hashToTest,"--extra") == 0) {
        g_testExtra = true;
        i++;
        if (argc > i)
          hashToTest = argv[i];
        else
          hashToTest = defaulthash;
      }
      /* default: --test=All. comma seperated list of options */
      if (strncmp(hashToTest,"--test=", 6) == 0) {
        char *opt = (char *)&hashToTest[7];
        char *rest = opt;
        char *p;
        bool found = false;
        g_testAll = false;
        do {
          if ((p = strchr(rest, ','))) {
            opt = strndup(rest, p-rest);
            rest = p+1;
          } else {
            opt = rest;
          }
          for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
            if (strcmp(opt, g_testopts[i].name) == 0) {
              g_testopts[i].var = true; found = true; break;
            }
          }
          if (!found) {
            printf("Invalid option: --test=%s\n", opt);
            printf("Valid tests: --test=%s", g_testopts[0].name);
            for(size_t i = 1; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
              printf(",%s", g_testopts[i].name);
            }
            printf("\n");
            exit(0);
          }
        } while (p);
      }
      i++;
      if (argc > i)
        hashToTest = argv[i];
      else
        hashToTest = defaulthash;
    }
  }

  // Code runs on the 3rd CPU by default
  //SetAffinity((1 << 2));
  //SelfTest();

  int timeBegin = clock();

  testHash(hashToTest);

  int timeEnd = clock();

  printf("\n");
  fflush(NULL);
  printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
  printf("Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
  printf("-------------------------------------------------------------------------------\n");
  fflush(NULL);
  return 0;
}